

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::received_bytes
          (session_impl *this,int bytes_payload,int bytes_protocol)

{
  undefined1 *puVar1;
  
  counters::inc_stats_counter(&this->m_stats_counters,0x84,(long)(bytes_protocol + bytes_payload));
  counters::inc_stats_counter(&this->m_stats_counters,0x83,(long)bytes_payload);
  puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x28;
  *(int *)puVar1 = *(int *)puVar1 + bytes_payload;
  puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x20;
  *(long *)puVar1 = *(long *)puVar1 + (long)bytes_payload;
  puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x38;
  *(int *)puVar1 = *(int *)puVar1 + bytes_protocol;
  puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x30;
  *(long *)puVar1 = *(long *)puVar1 + (long)bytes_protocol;
  return;
}

Assistant:

void session_impl::received_bytes(int bytes_payload, int bytes_protocol)
	{
		TORRENT_ASSERT(bytes_payload >= 0);
		TORRENT_ASSERT(bytes_protocol >= 0);
		m_stats_counters.inc_stats_counter(counters::recv_bytes
			, bytes_payload + bytes_protocol);
		m_stats_counters.inc_stats_counter(counters::recv_payload_bytes
			, bytes_payload);

		m_stat.received_bytes(bytes_payload, bytes_protocol);
	}